

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusSignature> *list)

{
  long lVar1;
  bool bVar2;
  QList<QDBusSignature> *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusSignature item;
  QDBusSignature *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray((QDBusArgument *)in_RSI);
  QList<QDBusSignature>::clear(in_RSI);
  while( true ) {
    bVar2 = QDBusArgument::atEnd((QDBusArgument *)in_stack_ffffffffffffffc8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    QDBusSignature::QDBusSignature(in_stack_ffffffffffffffc8);
    QDBusArgument::operator>>((QDBusArgument *)in_RSI,in_stack_ffffffffffffffc8);
    QList<QDBusSignature>::push_back(in_RSI,in_stack_ffffffffffffffc8);
    QDBusSignature::~QDBusSignature((QDBusSignature *)0x220afc);
  }
  QDBusArgument::endArray((QDBusArgument *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}